

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_gameboard.cpp
# Opt level: O0

void GameBoard::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *result;
  QString local_40;
  QObject *local_28;
  GameBoard *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    local_28 = _o;
    _t = (GameBoard *)_a;
    _a_local._0_4_ = _id;
    _a_local._4_4_ = _c;
    __id_local = _o;
    switch(_id) {
    case 0:
      QString::QString(&local_40,(QString *)_a[1]);
      setTextOnFields((GameBoard *)_o,&local_40);
      QString::~QString(&local_40);
      break;
    case 1:
      gameOver((GameBoard *)_o,*_a[1]);
      break;
    case 2:
      beginNewGame((GameBoard *)_o);
      break;
    case 3:
      handleButtonClick((GameBoard *)_o,*_a[1],*_a[2]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == setTextOnFields && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
    else {
      pcVar1 = *_a[1];
      if (pcVar1 == gameOver && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
        *(undefined4 *)*_a = 1;
      }
    }
  }
  return;
}

Assistant:

void GameBoard::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<GameBoard *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->setTextOnFields((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 1: _t->gameOver((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->beginNewGame(); break;
        case 3: _t->handleButtonClick((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (GameBoard::*)(QString );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&GameBoard::setTextOnFields)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (GameBoard::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&GameBoard::gameOver)) {
                *result = 1;
                return;
            }
        }
    }
}